

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O0

glyph_metrics_t * __thiscall
QFontEngineFT::scaledBitmapMetrics(QFontEngineFT *this,glyph_metrics_t *m,QTransform *t)

{
  qreal qVar1;
  qreal aheight;
  QFixed QVar2;
  QTransform *in_RCX;
  QRectF *in_RDX;
  QTransform *in_RSI;
  glyph_metrics_t *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  glyph_metrics_t *metrics;
  qreal scaleFactor;
  QPointF offset;
  QRectF rect;
  QTransform trans;
  qreal m33;
  glyph_metrics_t *this_00;
  qreal qVar4;
  qreal qVar5;
  QTransform *this_01;
  QPointF *p;
  QTransform *this_02;
  QTransform *this_03;
  QPointF local_88;
  QRectF local_78;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._64_8_ = -NAN;
  local_58._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._48_8_ = -NAN;
  local_58._56_8_ = -NAN;
  local_58._32_8_ = -NAN;
  local_58._40_8_ = -NAN;
  local_58._16_8_ = -NAN;
  local_58._24_8_ = -NAN;
  local_58._0_8_ = -NAN;
  local_58._8_8_ = -NAN;
  this_00 = in_RDI;
  this_03 = in_RSI;
  QTransform::QTransform((QTransform *)in_RDI);
  qVar1 = QTransform::m11(in_RCX);
  qVar4 = QTransform::m12(in_RCX);
  qVar5 = QTransform::m13(in_RCX);
  this_01 = (QTransform *)QTransform::m21(in_RCX);
  p = (QPointF *)QTransform::m22(in_RCX);
  this_02 = (QTransform *)QTransform::m23(in_RCX);
  m33 = QTransform::m33(in_RCX);
  QTransform::setMatrix
            ((QTransform *)local_58,qVar1,qVar4,qVar5,(qreal)this_01,(qreal)p,(qreal)this_02,0.0,0.0
             ,m33);
  QFixed::toReal((QFixed *)((long)in_RSI[0x21].m_matrix[0] + 0x14));
  QTransform::scale(this_01,qVar5,qVar4);
  local_78.w = -NAN;
  local_78.h = -NAN;
  local_78.xp = -NAN;
  local_78.yp = -NAN;
  qVar1 = QFixed::toReal((QFixed *)in_RDX);
  qVar4 = QFixed::toReal((QFixed *)((long)&in_RDX->xp + 4));
  qVar5 = QFixed::toReal((QFixed *)&in_RDX->yp);
  aheight = QFixed::toReal((QFixed *)((long)&in_RDX->yp + 4));
  QRectF::QRectF(&local_78,qVar1,qVar4,qVar5,aheight);
  local_88.xp = -NAN;
  local_88.yp = -NAN;
  qVar1 = QFixed::toReal((QFixed *)&in_RDX->w);
  qVar4 = QFixed::toReal((QFixed *)((long)&in_RDX->w + 4));
  QPointF::QPointF(&local_88,qVar1,qVar4);
  QTransform::mapRect(this_03,in_RDX);
  QVar3 = QTransform::map(this_02,p);
  local_88.xp = QVar3.xp;
  local_88.yp = QVar3.yp;
  *(undefined1 **)&in_RDI->xoff = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->width = &DAT_aaaaaaaaaaaaaaaa;
  glyph_metrics_t::glyph_metrics_t(this_00);
  QRectF::x(&local_78);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->x).val = QVar2.val;
  QRectF::y(&local_78);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->y).val = QVar2.val;
  QRectF::width(&local_78);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->width).val = QVar2.val;
  QRectF::height(&local_78);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->height).val = QVar2.val;
  QPointF::x(&local_88);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->xoff).val = QVar2.val;
  QPointF::y(&local_88);
  QVar2 = QFixed::fromReal(m33);
  (in_RDI->yoff).val = QVar2.val;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

glyph_metrics_t QFontEngineFT::scaledBitmapMetrics(const glyph_metrics_t &m, const QTransform &t) const
{
    QTransform trans;
    trans.setMatrix(t.m11(), t.m12(), t.m13(),
                    t.m21(), t.m22(), t.m23(),
                    0, 0, t.m33());
    const qreal scaleFactor = scalableBitmapScaleFactor.toReal();
    trans.scale(scaleFactor, scaleFactor);

    QRectF rect(m.x.toReal(), m.y.toReal(), m.width.toReal(), m.height.toReal());
    QPointF offset(m.xoff.toReal(), m.yoff.toReal());

    rect = trans.mapRect(rect);
    offset = trans.map(offset);

    glyph_metrics_t metrics;
    metrics.x = QFixed::fromReal(rect.x());
    metrics.y = QFixed::fromReal(rect.y());
    metrics.width = QFixed::fromReal(rect.width());
    metrics.height = QFixed::fromReal(rect.height());
    metrics.xoff = QFixed::fromReal(offset.x());
    metrics.yoff = QFixed::fromReal(offset.y());
    return metrics;
}